

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void do_animation(void)

{
  uint8_t selection_attr;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  monster_conflict *mon_00;
  uint8_t base_attr;
  monster *mon;
  uint8_t attr;
  wchar_t i;
  
  mon._4_4_ = L'\x01';
  do {
    wVar2 = cave_monster_max(cave);
    if (wVar2 <= mon._4_4_) {
      flicker = flicker + '\x01';
      return;
    }
    mon_00 = cave_monster(cave,mon._4_4_);
    if (((mon_00 != (monster_conflict *)0x0) && (mon_00->race != (monster_race *)0x0)) &&
       (_Var1 = monster_is_visible((monster *)mon_00), _Var1)) {
      _Var1 = flag_has_dbg(mon_00->race->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI");
      if (_Var1) {
        uVar3 = Rand_div(0x1d);
        mon._3_1_ = (char)uVar3 + '\x01';
      }
      else {
        _Var1 = flag_has_dbg(mon_00->race->flags,0xc,0xb,"mon->race->flags","RF_ATTR_FLICKER");
        if (!_Var1) goto LAB_00230ebc;
        selection_attr = monster_x_attr[mon_00->race->ridx];
        mon._3_1_ = visuals_cycler_get_attr_for_race(mon_00->race,(ulong)flicker);
        if (mon._3_1_ == '\x1e') {
          mon._3_1_ = visuals_flicker_get_attr_for_frame(selection_attr,(ulong)flicker);
        }
        if (mon._3_1_ == '\x1e') {
          mon._3_1_ = selection_attr;
        }
      }
      mon_00->attr = mon._3_1_;
      player->upkeep->redraw = player->upkeep->redraw | 0x410000;
    }
LAB_00230ebc:
    mon._4_4_ = mon._4_4_ + L'\x01';
  } while( true );
}

Assistant:

static void do_animation(void)
{
	int i;

	for (i = 1; i < cave_monster_max(cave); i++) {
		uint8_t attr;
		struct monster *mon = cave_monster(cave, i);

		if (!mon || !mon->race || !monster_is_visible(mon))
			continue;
		else if (rf_has(mon->race->flags, RF_ATTR_MULTI))
			attr = randint1(BASIC_COLORS - 1);
		else if (rf_has(mon->race->flags, RF_ATTR_FLICKER)) {
			uint8_t base_attr = monster_x_attr[mon->race->ridx];

			/* Get the color cycled attribute, if available. */
			attr = visuals_cycler_get_attr_for_race(mon->race, flicker);

			if (attr == BASIC_COLORS) {
				/* Fall back to the flicker attribute. */
				attr = visuals_flicker_get_attr_for_frame(base_attr, flicker);
			}

			if (attr == BASIC_COLORS) {
				/* Fall back to the static attribute if cycling fails. */
				attr = base_attr;
			}
		}
		else
			continue;

		mon->attr = attr;
		player->upkeep->redraw |= (PR_MAP | PR_MONLIST);
	}

	flicker++;
}